

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sign.c
# Opt level: O1

HCOSE_SIGNER COSE_Sign_GetSigner(HCOSE_SIGN cose,int iSigner,cose_errback *perr)

{
  _Bool _Var1;
  HCOSE_SIGNER p_Var2;
  
  if ((cose != (HCOSE_SIGN)0x0) && (_Var1 = _COSE_IsInList(SignRoot,(COSE *)cose), _Var1)) {
    p_Var2 = *(HCOSE_SIGNER *)(cose + 0x58);
    if (0 < iSigner) {
      do {
        if (p_Var2 == (HCOSE_SIGNER)0x0) {
          if (perr == (cose_errback *)0x0) {
            return (HCOSE_SIGNER)0x0;
          }
          perr->err = COSE_ERR_INVALID_PARAMETER;
          return (HCOSE_SIGNER)0x0;
        }
        p_Var2 = *(HCOSE_SIGNER *)(p_Var2 + 0x60);
        iSigner = iSigner + -1;
      } while (iSigner != 0);
    }
    *(int *)(p_Var2 + 0x10) = *(int *)(p_Var2 + 0x10) + 1;
    return p_Var2;
  }
  if (perr != (cose_errback *)0x0) {
    perr->err = COSE_ERR_INVALID_HANDLE;
  }
  return (HCOSE_SIGNER)0x0;
}

Assistant:

HCOSE_SIGNER COSE_Sign_GetSigner(HCOSE_SIGN cose, int iSigner, cose_errback * perr)
{
	int i;
	COSE_SignerInfo * p;

	if (!IsValidSignHandle(cose)) {
		if (perr != NULL) perr->err = COSE_ERR_INVALID_HANDLE;
		return NULL;
	}

	p = ((COSE_SignMessage *)cose)->m_signerFirst;
	for (i = 0; i < iSigner; i++) {
		if (p == NULL) {
			if (perr != NULL) perr->err = COSE_ERR_INVALID_PARAMETER;
			return NULL;
		}
		p = p->m_signerNext;
	}
	p->m_message.m_refCount++;

	return (HCOSE_SIGNER)p;
}